

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall
QTextOdfWriter::writeTableFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextTableFormat format,int formatIndex)

{
  char *pcVar1;
  char16_t *pcVar2;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this_00;
  ulong uVar3;
  undefined1 auVar4 [16];
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  Data *pDVar10;
  int iVar11;
  uint uVar12;
  Node<int,_QHashDummyValue> *pNVar13;
  QSharedDataPointer<QTextFormatPrivate> this_01;
  storage_type *psVar14;
  size_t sVar15;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar16;
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QAnyStringView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QAnyStringView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QAnyStringView QVar41;
  QByteArrayView QVar42;
  QAnyStringView QVar43;
  QByteArrayView QVar44;
  QAnyStringView QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QAnyStringView QVar49;
  QAnyStringView QVar50;
  QAnyStringView QVar51;
  QAnyStringView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QAnyStringView QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QAnyStringView QVar60;
  QAnyStringView QVar61;
  QAnyStringView QVar62;
  QAnyStringView QVar63;
  QAnyStringView QVar64;
  QAnyStringView QVar65;
  QTextLength QVar66;
  int copy;
  QList<QTextLength> local_118;
  QStringBuilder<QString,_QLatin1String> local_f8;
  QAnyStringView local_c8;
  char16_t *local_b8;
  ulong uStack_b0;
  char16_t *local_a8;
  ulong uStack_a0;
  char16_t *local_98;
  ulong uStack_90;
  QArrayData *local_88;
  char16_t *pcStack_80;
  ulong local_78;
  QString local_68;
  char16_t *local_50;
  ulong uStack_48;
  qint32 local_3c;
  long local_38;
  
  this_01.d.ptr = format.super_QTextFrameFormat.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = format.super_QTextFrameFormat.super_QTextFormat.format_type;
  pcVar2 = (this->styleNS).d.ptr;
  uVar18 = (this->styleNS).d.size;
  QVar19.m_data = &DAT_00000005;
  QVar19.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar19);
  QVar20.m_size = (size_t)pcVar2;
  QVar20.field_0.m_data_utf8 = (char *)writer;
  QVar46.m_size = (size_t)local_f8.a.d.ptr;
  QVar46.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar20,QVar46);
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar18 = (this->styleNS).d.size;
  QVar21.m_data = (storage_type *)0x4;
  QVar21.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar21);
  pcVar8 = local_f8.a.d.ptr;
  aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
  QVar22.m_data = (storage_type *)0x7;
  QVar22.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar22);
  sVar15 = 0x20;
  QString::arg_impl((longlong)&local_68,(int)&local_88,local_3c,(QChar)0x0);
  local_50 = local_68.d.ptr;
  uStack_48 = local_68.d.size | 0x8000000000000000;
  QVar5.m_size = (size_t)pcVar2;
  QVar5.field_0.m_data_utf8 = (char *)writer;
  QVar47.m_size = (size_t)pcVar8;
  QVar47.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QVar58.m_size = sVar15;
  QVar58.field_0.m_data = aVar16.m_data;
  QXmlStreamWriter::writeAttribute(QVar5,QVar47,QVar58);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar18 = (this->styleNS).d.size;
  QVar23.m_data = &DAT_00000006;
  QVar23.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar23);
  pcVar8 = local_f8.a.d.ptr;
  aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
  QVar24.m_data = &DAT_00000005;
  QVar24.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar24);
  local_98 = local_68.d.ptr;
  uStack_90 = local_68.d.size | 0x8000000000000000;
  QVar25.m_size = (size_t)pcVar2;
  QVar25.field_0.m_data_utf8 = (char *)writer;
  QVar48.m_size = (size_t)pcVar8;
  QVar48.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QVar59.m_size = sVar15;
  QVar59.field_0.m_data = aVar16.m_data;
  QXmlStreamWriter::writeAttribute(QVar25,QVar48,QVar59);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar18 = (this->styleNS).d.size;
  QVar26.m_data = &DAT_00000010;
  QVar26.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar26);
  QVar27.m_size = (size_t)pcVar2;
  QVar27.field_0.m_data_utf8 = (char *)writer;
  QVar49.m_size = (size_t)local_f8.a.d.ptr;
  QVar49.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar27,QVar49);
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = (this->m_tableFormatsWithBorders).q_hash.d;
  if ((this_00 != (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) &&
     (pNVar13 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
                          (this_00,&local_3c), pNVar13 != (Node<int,_QHashDummyValue> *)0x0)) {
    pcVar2 = (this->tableNS).d.ptr;
    uVar18 = (this->tableNS).d.size;
    QVar28.m_data = &DAT_0000000c;
    QVar28.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar28);
    pcVar8 = local_f8.a.d.ptr;
    aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
    QVar29.m_data = (storage_type *)0xa;
    QVar29.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar29);
    local_a8 = local_68.d.ptr;
    uStack_a0 = local_68.d.size | 0x8000000000000000;
    QVar30.m_size = (size_t)pcVar2;
    QVar30.field_0.m_data_utf8 = (char *)writer;
    QVar50.m_size = (size_t)pcVar8;
    QVar50.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QVar60.m_size = sVar15;
    QVar60.field_0.m_data = aVar16.m_data;
    QXmlStreamWriter::writeAttribute(QVar30,QVar50,QVar60);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar11 = QTextFormat::intProperty((QTextFormat *)this_01.d.ptr,0x1010);
  uVar12 = iVar11 - 1;
  if ((uVar12 < 8) && ((0x8bU >> (uVar12 & 0x1f) & 1) != 0)) {
    lVar17 = *(long *)(&DAT_007e0d98 + (ulong)uVar12 * 8);
    pcVar2 = (this->tableNS).d.ptr;
    uVar18 = (this->tableNS).d.size;
    QVar31.m_data = &DAT_00000005;
    QVar31.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar31);
    pcVar8 = local_f8.a.d.ptr;
    psVar14 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar14 + lVar17 + 1;
      psVar14 = psVar14 + 1;
    } while (*pcVar1 != '\0');
    aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
    QVar32.m_data = psVar14;
    QVar32.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar32);
    local_b8 = local_68.d.ptr;
    uStack_b0 = local_68.d.size | 0x8000000000000000;
    QVar6.m_size = (size_t)pcVar2;
    QVar6.field_0.m_data_utf8 = (char *)writer;
    QVar51.m_size = (size_t)pcVar8;
    QVar51.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QVar61.m_size = sVar15;
    QVar61.field_0.m_data = aVar16.m_data;
    QXmlStreamWriter::writeAttribute(QVar6,QVar51,QVar61);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QVar66 = QTextFormat::lengthProperty((QTextFormat *)this_01.d.ptr,0x4003);
  if ((QVar66.fixedValueOrPercentage != 0.0) || (NAN(QVar66.fixedValueOrPercentage))) {
    pcVar2 = (this->styleNS).d.ptr;
    uVar18 = (this->styleNS).d.size;
    QVar33.m_data = &DAT_00000005;
    QVar33.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar33);
    pcVar8 = local_68.d.ptr;
    aVar16.m_data = (void *)(local_68.d.size | 0x8000000000000000);
    QVar66 = QTextFormat::lengthProperty((QTextFormat *)this_01.d.ptr,0x4003);
    QString::number(QVar66.fixedValueOrPercentage,(char)&local_88,0x67);
    local_f8.a.d.size = local_78;
    local_f8.a.d.ptr = pcStack_80;
    local_f8.a.d.d = (Data *)local_88;
    local_88 = (QArrayData *)0x0;
    pcStack_80 = (char16_t *)0x0;
    local_78 = 0;
    local_f8.b.m_size = 2;
    local_f8.b.m_data = "pt";
    local_118.d.size = 0;
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (QTextLength *)0x0;
    QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
              (&local_c8,&local_f8,
               (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)&local_118);
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data_utf8 = (char *)writer;
    QVar52.m_size = (size_t)pcVar8;
    QVar52.field_0.m_data = (void *)(uVar18 | 0x8000000000000000);
    QVar62.m_size = sVar15;
    QVar62.field_0.m_data = aVar16.m_data;
    QXmlStreamWriter::writeAttribute(QVar7,QVar52,QVar62);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  QTextFormat::lengthVectorProperty
            ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
  qVar9 = local_f8.a.d.size;
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (qVar9 != 0) {
    local_f8.a.d.d = (Data *)CONCAT44(local_f8.a.d.d._4_4_,local_3c);
    QHash<int,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<int,QHashDummyValue> *)&this->m_tableFormatsWithColWidthConstraints,
               (int *)&local_f8,(QHashDummyValue *)&local_68);
    lVar17 = 0;
    uVar18 = 0;
    while( true ) {
      QTextFormat::lengthVectorProperty
                ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
      qVar9 = local_f8.a.d.size;
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      if ((ulong)qVar9 <= uVar18) break;
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar34.m_data = &DAT_00000005;
      QVar34.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar34);
      QVar35.m_size = (size_t)pcVar2;
      QVar35.field_0.m_data_utf8 = (char *)writer;
      QVar53.m_size = (size_t)local_f8.a.d.ptr;
      QVar53.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeStartElement(QVar35,QVar53);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar36.m_data = (storage_type *)0x4;
      QVar36.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar36);
      pcVar8 = local_f8.a.d.ptr;
      aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar37.m_data = (storage_type *)0xa;
      QVar37.m_size = (qsizetype)&local_118;
      QString::fromLatin1(QVar37);
      QString::arg_impl((longlong)&local_88,(int)&local_118,local_3c,(QChar)0x0);
      sVar15 = 0x20;
      QString::arg_impl((longlong)&local_68,(int)&local_88,(int)uVar18,(QChar)0x0);
      QVar38.m_size = (size_t)pcVar2;
      QVar38.field_0.m_data_utf8 = (char *)writer;
      QVar54.m_size = (size_t)pcVar8;
      QVar54.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar63.m_size = sVar15;
      QVar63.field_0.m_data = aVar16.m_data;
      QXmlStreamWriter::writeAttribute(QVar38,QVar54,QVar63);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar39.m_data = &DAT_00000006;
      QVar39.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar39);
      pcVar8 = local_f8.a.d.ptr;
      aVar16.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar40.m_data = &DAT_0000000c;
      QVar40.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar40);
      QVar41.m_size = (size_t)pcVar2;
      QVar41.field_0.m_data_utf8 = (char *)writer;
      QVar55.m_size = (size_t)pcVar8;
      QVar55.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar64.m_size = sVar15;
      QVar64.field_0.m_data = aVar16.m_data;
      QXmlStreamWriter::writeAttribute(QVar41,QVar55,QVar64);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar42.m_data = (storage_type *)0x17;
      QVar42.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar42);
      QVar43.m_size = (size_t)pcVar2;
      QVar43.field_0.m_data_utf8 = (char *)writer;
      QVar56.m_size = (size_t)local_f8.a.d.ptr;
      QVar56.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeEmptyElement(QVar43,QVar56);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      QTextFormat::lengthVectorProperty
                ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
      iVar11 = *(int *)((long)local_f8.a.d.ptr + lVar17);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      if (iVar11 == 2) {
        QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
        QString::number(*(double *)((long)&(local_118.d.ptr)->fixedValueOrPercentage + lVar17),
                        (char)&local_88,0x67);
LAB_005bc4cc:
        local_f8.a.d.d = (Data *)local_88;
        local_f8.a.d.ptr = pcStack_80;
        local_f8.a.d.size = local_78;
        local_f8.b.m_size = 1;
        local_f8.b.m_data = "%";
      }
      else {
        QTextFormat::lengthVectorProperty
                  ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
        iVar11 = *(int *)((long)local_f8.a.d.ptr + lVar17);
        if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
          }
        }
        if (iVar11 != 1) {
          QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_118.d.size;
          QString::number((longlong)&local_88,SUB164((ZEXT816(0) << 0x40 | ZEXT816(100)) / auVar4,0)
                         );
          goto LAB_005bc4cc;
        }
        QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
        QString::number(*(double *)((long)&(local_118.d.ptr)->fixedValueOrPercentage + lVar17),
                        (char)&local_88,0x67);
        local_f8.a.d.d = (Data *)local_88;
        local_f8.a.d.ptr = pcStack_80;
        local_f8.a.d.size = local_78;
        local_f8.b.m_size = 2;
        local_f8.b.m_data = "pt";
      }
      local_78 = 0;
      pcStack_80 = (char16_t *)0x0;
      local_88 = (QArrayData *)0x0;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_f8);
      pDVar10 = local_68.d.d;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_68.d.size = 0;
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar44.m_data = &DAT_0000000c;
      QVar44.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar44);
      QVar65.field_0.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar45.m_size = (size_t)pcVar2;
      QVar45.field_0.m_data_utf8 = (char *)writer;
      QVar57.m_size = (size_t)local_f8.a.d.ptr;
      QVar57.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar65.m_size = sVar15;
      QXmlStreamWriter::writeAttribute(QVar45,QVar57,QVar65);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      QXmlStreamWriter::writeEndElement();
      if (&pDVar10->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
        }
      }
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeTableFormat(QXmlStreamWriter &writer, QTextTableFormat format, int formatIndex) const
{
    // start writing table style element
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                          QString::fromLatin1("Table%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-properties"));

    if (m_tableFormatsWithBorders.contains(formatIndex)) {
        // write border format collapsing to table style
        writer.writeAttribute(tableNS, QString::fromLatin1("border-model"),
                              QString::fromLatin1("collapsing"));
    }
    const char* align = nullptr;
    switch (format.alignment()) {
    case Qt::AlignLeft:
        align = "left";
        break;
    case Qt::AlignRight:
        align = "right";
        break;
    case Qt::AlignHCenter:
        align = "center";
        break;
    case Qt::AlignJustify:
        align = "margins";
        break;
    }
    if (align)
       writer.writeAttribute(tableNS, QString::fromLatin1("align"), QString::fromLatin1(align));
    if (format.width().rawValue()) {
        writer.writeAttribute(styleNS, QString::fromLatin1("width"),
                              QString::number(format.width().rawValue()) + "pt"_L1);
    }
    writer.writeEndElement();
    // start writing table-column style element
    if (format.columnWidthConstraints().size()) {
        // write table-column-properties for columns with constraints
        m_tableFormatsWithColWidthConstraints.insert(formatIndex); // needed for linking of columns to styles
        for (int colit = 0; colit < format.columnWidthConstraints().size(); ++colit) {
            writer.writeStartElement(styleNS, QString::fromLatin1("style"));
            writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                                  QString::fromLatin1("Table%1.%2").arg(formatIndex).arg(colit));
            writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-column"));
            writer.writeEmptyElement(styleNS, QString::fromLatin1("table-column-properties"));
            QString columnWidth;
            if (format.columnWidthConstraints().at(colit).type() == QTextLength::PercentageLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "%"_L1;
            } else if (format.columnWidthConstraints().at(colit).type() == QTextLength::FixedLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "pt"_L1;
            } else {
                //!! HARD-CODING variableWidth Constraints to 100% / nr constraints
                columnWidth = QString::number(100 / format.columnWidthConstraints().size())
                                      + "%"_L1;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("column-width"), columnWidth);
            writer.writeEndElement();
        }
    }
}